

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# efsw-test.c
# Opt level: O0

efsw_watchid handleWatchID(efsw_watchid watchid)

{
  char *pcVar1;
  efsw_watchid watchid_local;
  
  if ((watchid + 7U < 3) || (watchid + 3U < 3)) {
    pcVar1 = efsw_getlasterror();
    printf("%s\n",pcVar1);
  }
  else {
    printf("Added WatchID: %ld\n",watchid);
  }
  return watchid;
}

Assistant:

efsw_watchid handleWatchID( efsw_watchid watchid ) {
	switch ( watchid ) {
		case EFSW_NOTFOUND:
		case EFSW_REPEATED:
		case EFSW_OUTOFSCOPE:
		case EFSW_REMOTE:
		case EFSW_WATCHER_FAILED:
		case EFSW_UNSPECIFIED: {
			printf( "%s\n", efsw_getlasterror() );
			break;
		}
		default: {
			printf( "Added WatchID: %ld\n", watchid );
		}
	}

	return watchid;
}